

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> * __thiscall
kj::Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
          (Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *this,
          ControlMessage *other)

{
  ControlMessage *other_00;
  ControlMessage *other_local;
  Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *this_local;
  
  other_00 = mv<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>(other);
  kj::_::NullableValue<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
            (&this->ptr,other_00);
  return this;
}

Assistant:

inline Maybe& operator=(T&& other) { ptr = kj::mv(other); return *this; }